

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.h
# Opt level: O3

void __thiscall cmMakefile::AddGlobalLinkInformation(cmMakefile *this,string *name,cmTarget *target)

{
  pointer d;
  
  if (target->TargetTypeValue - UTILITY < 3) {
    return;
  }
  for (d = (this->LinkDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      d != (this->LinkDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; d = d + 1) {
    cmTarget::AddLinkDirectory(target,d);
  }
  cmTarget::MergeLinkLibraries(target,this,name,&this->LinkLibraries);
  return;
}

Assistant:

TargetType GetType() const
    {
    return this->TargetTypeValue;
    }